

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::rayTest
          (cbtAxisSweep3Internal<unsigned_int> *this,cbtVector3 *rayFrom,cbtVector3 *rayTo,
          cbtBroadphaseRayCallback *rayCallback,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  ulong uVar1;
  
  if (this->m_raycastAccelerator != (cbtDbvtBroadphase *)0x0) {
    (*(this->m_raycastAccelerator->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface[6])();
    return;
  }
  if ((this->m_numHandles & 0x7fffffff) != 0) {
    uVar1 = 0;
    do {
      if ((this->m_pEdges[0][uVar1 + 1].m_pos & 1) != 0) {
        (*(rayCallback->super_cbtBroadphaseAabbCallback)._vptr_cbtBroadphaseAabbCallback[2])
                  (rayCallback,this->m_pHandles + this->m_pEdges[0][uVar1 + 1].m_handle);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->m_numHandles * 2);
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::rayTest(const cbtVector3& rayFrom, const cbtVector3& rayTo, cbtBroadphaseRayCallback& rayCallback, const cbtVector3& aabbMin, const cbtVector3& aabbMax)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->rayTest(rayFrom, rayTo, rayCallback, aabbMin, aabbMax);
	}
	else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i = 1; i < m_numHandles * 2 + 1; i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				rayCallback.process(getHandle(m_pEdges[axis][i].m_handle));
			}
		}
	}
}